

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_108b30::CDEFCopyRect16to16Test_TestSIMDNoMismatch_Test::TestBody
          (CDEFCopyRect16to16Test_TestSIMDNoMismatch_Test *this)

{
  CDEFCopyRect16To16 in_stack_00000110;
  CDEFCopyRect16To16 in_stack_00000118;
  CDEFCopyRect16to16Test *in_stack_00000120;
  
  CDEFCopyRect16to16Test::test_copy_rect_16_to_16
            (in_stack_00000120,in_stack_00000118,in_stack_00000110);
  return;
}

Assistant:

TEST_P(CDEFCopyRect16to16Test, TestSIMDNoMismatch) {
  test_copy_rect_16_to_16(test_func_, ref_func_);
}